

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O0

void microatf_context_pass(microatf_context_t *context)

{
  microatf_context_t *context_local;
  
  if (context->expect == MICROATF_EXPECT_FAIL) {
    microatf_context_write_result
              (context,"failed",-1,"Test case was expecting a failure but got a pass instead");
    microatf_context_exit(context,1);
  }
  if (context->expect == MICROATF_EXPECT_PASS) {
    microatf_context_write_result(microatf_context,"passed",-1,(char *)0x0);
    microatf_context_exit(microatf_context,0);
  }
  microatf_context_write_result
            (context,"failed",-1,
             "Test case asked to explicitly pass but was not expecting such condition");
  microatf_context_exit(context,1);
}

Assistant:

MICROATF_ATTRIBUTE_NORETURN
static void
microatf_context_pass(microatf_context_t *context)
{
	if (context->expect == MICROATF_EXPECT_FAIL) {
		microatf_context_write_result(context, "failed", -1,
		    "Test case was expecting a failure but got a pass "
		    "instead");
		microatf_context_exit(context, EXIT_FAILURE);
	} else if (context->expect == MICROATF_EXPECT_PASS) {
		microatf_context_write_result(microatf_context, "passed", -1,
		    NULL);
		microatf_context_exit(microatf_context, EXIT_SUCCESS);
	} else {
		microatf_context_write_result(context, "failed", -1,
		    "Test case asked to explicitly pass but was not expecting "
		    "such condition");
		microatf_context_exit(context, EXIT_FAILURE);
	}
}